

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silent_printf.cpp
# Opt level: O2

int Silent_PAL_vfprintf(PAL_FILE *stream,char *format,__va_list_tag *aparg)

{
  LPCWSTR lpWideCharStr;
  char *pvBuffer;
  BOOL BVar1;
  uint uVar2;
  int iVar3;
  INT IVar4;
  int iVar5;
  ulong uVar6;
  LPSTR lpMultiByteStr;
  LPSTR pCVar7;
  short *psVar8;
  INT *pIVar9;
  undefined8 *puVar10;
  int *piVar11;
  undefined2 *puVar12;
  int iVar13;
  int iVar14;
  long in_FS_OFFSET;
  undefined1 auStack_4a8 [8];
  CHAR TempBuffer [4];
  uint local_480;
  int local_47c;
  INT Prefix;
  int local_474;
  INT Flags;
  LPCSTR Fmt;
  int iStack_460;
  WCHAR TempWChar;
  INT Type;
  INT Width;
  INT Precision;
  va_list ap;
  CHAR local_438 [8];
  CHAR TempBuff [1024];
  
  TempBuff._1016_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  ap[0].overflow_arg_area = aparg->reg_save_area;
  Width = aparg->gp_offset;
  Precision = aparg->fp_offset;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  local_474 = -1;
  iVar13 = 0;
  _Flags = format;
LAB_00143b2e:
  do {
    while( true ) {
      if (*_Flags == '%') break;
      iVar14 = iVar13;
      if (*_Flags == '\0') goto LAB_0014411b;
LAB_00143be3:
      pvBuffer = _Flags;
      _Flags = _Flags + 1;
      PAL_fwrite(pvBuffer,1,1,stream);
      iVar14 = local_474;
      if (stream->PALferrorCode == 1) goto LAB_0014411b;
      iVar13 = iVar13 + 1;
    }
    BVar1 = Silent_ExtractFormatA
                      ((LPCSTR *)&Flags,local_438,&Prefix,&stack0xfffffffffffffba0,&Type,
                       (LPINT)&local_480,(LPINT)((long)&Fmt + 4));
    iVar3 = iStack_460;
    iVar5 = Fmt._4_4_;
    uVar2 = local_480;
    if (BVar1 == 0) goto LAB_00143be3;
    ap[0].reg_save_area._4_4_ = iVar13;
    if (Fmt._4_4_ != 2 || (local_480 ^ 2) != 0) {
      if ((local_480 ^ 2) == 0 && Fmt._4_4_ == 1) {
        uVar2 = Width;
        if (iStack_460 + 3U < 2) {
          if ((uint)Width < 0x29) {
            uVar2 = Width + 8;
            _Width = CONCAT44(Precision,uVar2);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((Type & 0xfffffffdU) == 0xfffffffc) {
          if (uVar2 < 0x29) {
            uVar2 = uVar2 + 8;
            _Width = CONCAT44(Precision,uVar2);
            goto LAB_00143ec2;
          }
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
LAB_00143ee3:
          puVar12 = (undefined2 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        else {
LAB_00143ec2:
          if (0x28 < uVar2) goto LAB_00143ee3;
          _Width = CONCAT44(Precision,uVar2 + 8);
          puVar12 = (undefined2 *)((ulong)uVar2 + (long)ap[0].overflow_arg_area);
        }
        Fmt._2_2_ = *puVar12;
        iVar5 = Silent_WideCharToMultiByte((LPCWSTR)((long)&Fmt + 2),1,auStack_4a8,4);
        iVar14 = local_474;
        if (iVar5 == 0) goto LAB_0014411b;
        TempBuffer[(long)iVar5 + -8] = '\0';
        IVar4 = Silent_AddPaddingVfprintf(stream,auStack_4a8,iVar3 - iVar5,Prefix);
        iVar14 = local_474;
        if (IVar4 == -1) goto LAB_0014411b;
        iVar13 = iVar13 + IVar4;
      }
      else if (Fmt._4_4_ == 6) {
        if (iStack_460 == -2) {
          uVar6 = _Width & 0xffffffff;
          if (uVar6 < 0x29) {
            _Width = CONCAT44(Precision,Width + 8);
            piVar11 = (int *)(uVar6 + (long)ap[0].overflow_arg_area);
          }
          else {
            piVar11 = (int *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          iStack_460 = *piVar11;
        }
        if (Type == -2) {
          uVar6 = _Width & 0xffffffff;
          if (uVar6 < 0x29) {
            _Width = CONCAT44(Precision,Width + 8);
            pIVar9 = (INT *)(uVar6 + (long)ap[0].overflow_arg_area);
          }
          else {
            pIVar9 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Type = *pIVar9;
        }
        if (local_480 == 1) {
          uVar6 = _Width & 0xffffffff;
          if (uVar6 < 0x29) {
            _Width = CONCAT44(Precision,Width + 8);
            puVar10 = (undefined8 *)(uVar6 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar10 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(short *)*puVar10 = (short)iVar13;
        }
        else {
          uVar6 = _Width & 0xffffffff;
          if (uVar6 < 0x29) {
            _Width = CONCAT44(Precision,Width + 8);
            puVar10 = (undefined8 *)(uVar6 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar10 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(int *)*puVar10 = iVar13;
        }
      }
      else {
        if ((Fmt._4_4_ == 5 && (local_480 ^ 1) == 0) || ((local_480 ^ 1) == 0 && Fmt._4_4_ == 4)) {
          uVar6 = _Width & 0xffffffff;
          if (uVar6 < 0x29) {
            _Width = CONCAT44(Precision,Width + 8);
            psVar8 = (short *)(uVar6 + (long)ap[0].overflow_arg_area);
          }
          else {
            psVar8 = (short *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          iVar3 = fprintf((FILE *)stream,local_438,(ulong)(uint)(int)*psVar8);
        }
        else {
          auStack_4a8 = (undefined1  [8])_Width;
          _TempBuffer = (void *)ap[0]._0_8_;
          iVar3 = PAL_vfprintf(stream,local_438,(__va_list_tag *)auStack_4a8);
          PAL_printf_arg_remover((va_list *)&Width,iStack_460,Type,iVar5,uVar2);
          iVar13 = ap[0].reg_save_area._4_4_;
        }
        if (iVar3 == -1) {
          iVar3 = 0;
        }
        iVar13 = iVar13 + iVar3;
      }
      goto LAB_00143b2e;
    }
    if (iStack_460 == -3) {
      if ((uint)Width < 0x29) {
        _Width = CONCAT44(Precision,Width + 8);
      }
      else {
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      iVar13 = -3;
    }
    else {
      iVar13 = iStack_460;
      if (iStack_460 == -2) {
        uVar6 = _Width & 0xffffffff;
        if (uVar6 < 0x29) {
          _Width = CONCAT44(Precision,Width + 8);
          piVar11 = (int *)(uVar6 + (long)ap[0].overflow_arg_area);
        }
        else {
          piVar11 = (int *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        iVar13 = *piVar11;
        iStack_460 = iVar13;
      }
    }
    uVar6 = _Width & 0xffffffff;
    if (Type == -4) {
      if ((uint)Width < 0x29) {
        uVar6 = (ulong)(Width + 8U);
        _Width = CONCAT44(Precision,Width + 8U);
        iVar5 = -4;
        goto LAB_00143d8b;
      }
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
      iVar5 = -4;
LAB_00143db0:
      puVar10 = (undefined8 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    else {
      iVar5 = Type;
      if (Type == -2) {
        if ((uint)Width < 0x29) {
          piVar11 = (int *)((long)ap[0].overflow_arg_area + uVar6);
          uVar6 = (ulong)(Width + 8U);
          _Width = CONCAT44(Precision,Width + 8U);
        }
        else {
          piVar11 = (int *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        iVar5 = *piVar11;
        Type = iVar5;
      }
LAB_00143d8b:
      if (0x28 < (uint)uVar6) goto LAB_00143db0;
      _Width = CONCAT44(Precision,(uint)uVar6 + 8);
      puVar10 = (undefined8 *)(uVar6 + (long)ap[0].overflow_arg_area);
    }
    lpWideCharStr = (LPCWSTR)*puVar10;
    iVar3 = Silent_WideCharToMultiByte(lpWideCharStr,-1,(LPSTR)0x0,0);
    iVar14 = local_474;
    if ((iVar3 == 0) ||
       (lpMultiByteStr = (LPSTR)PAL_malloc((long)iVar3), iVar14 = local_474,
       lpMultiByteStr == (LPSTR)0x0)) goto LAB_0014411b;
    pCVar7 = lpMultiByteStr;
    iVar14 = 0;
    local_47c = iVar13;
    if (iVar5 == -3) {
LAB_00143e38:
      *pCVar7 = '\0';
    }
    else {
      iVar14 = iVar3 + -1;
      if ((0 < iVar5) && (iVar5 < iVar14)) {
        iVar13 = Silent_WideCharToMultiByte(lpWideCharStr,iVar5,lpMultiByteStr,iVar3);
        if (iVar13 != 0) {
          pCVar7 = lpMultiByteStr + iVar13;
          iVar14 = iVar5;
          goto LAB_00143e38;
        }
LAB_00144113:
        PAL_free(lpMultiByteStr);
        iVar14 = local_474;
LAB_0014411b:
        local_474 = iVar14;
        if (*(long *)(in_FS_OFFSET + 0x28) != TempBuff._1016_8_) {
          __stack_chk_fail();
        }
        return local_474;
      }
      iVar13 = Silent_WideCharToMultiByte(lpWideCharStr,-1,lpMultiByteStr,iVar3);
      if (iVar13 == 0) goto LAB_00144113;
    }
    IVar4 = Silent_AddPaddingVfprintf(stream,lpMultiByteStr,local_47c - iVar14,Prefix);
    if (IVar4 == -1) goto LAB_00144113;
    iVar13 = ap[0].reg_save_area._4_4_ + IVar4;
    PAL_free(lpMultiByteStr);
  } while( true );
}

Assistant:

int Silent_PAL_vfprintf(PAL_FILE *stream, const char *format, va_list aparg)
{
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPCSTR Fmt = format;
    LPWSTR TempWStr;
    LPSTR TempStr;
    WCHAR TempWChar;
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT Length;
    INT TempInt;
    int wctombResult;
    int written = 0;
    int paddingReturnValue;
    va_list ap;
    
    va_copy(ap, aparg);

    while (*Fmt)
    {
        if (*Fmt == '%' &&
            TRUE == Silent_ExtractFormatA(&Fmt, TempBuff, &Flags, &Width, 
                                          &Precision, &Prefix, &Type))
        {
            if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_STRING)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWStr = va_arg(ap, LPWSTR);
                Length = Silent_WideCharToMultiByte(TempWStr, -1, 0, 0);
                if (!Length)
                {
                    va_end(ap);
                    return -1;
                }
                TempStr = (LPSTR) PAL_malloc(Length);
                if (!TempStr)
                {
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *TempStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length - 1)
                {
                    Length = Silent_WideCharToMultiByte(TempWStr, Precision, 
                                                        TempStr, Length);
                    if (!Length)
                    {
                        PAL_free(TempStr);
                        va_end(ap);
                        return -1;
                    }
                    TempStr[Length] = 0;
                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    wctombResult = Silent_WideCharToMultiByte(TempWStr, -1, 
                                                              TempStr, Length);
                    if (!wctombResult)
                    {
                        PAL_free(TempStr);
                        va_end(ap);
                        return -1;
                    }
                    --Length; /* exclude null char */
                }

                /* do the padding (if needed)*/
                paddingReturnValue =
                  Silent_AddPaddingVfprintf(stream, TempStr, Width - Length, Flags);
                if (-1 == paddingReturnValue)
                {
                    PAL_free(TempStr);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;

                PAL_free(TempStr);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                CHAR TempBuffer[4];
                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }
                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar = va_arg(ap, int);
                Length = Silent_WideCharToMultiByte(&TempWChar, 1, TempBuffer, 4);
                if (!Length)
                {
                    va_end(ap);
                    return -1;
                }
                TempBuffer[Length] = 0;

                /* do the padding (if needed)*/
                paddingReturnValue =
                  Silent_AddPaddingVfprintf(stream, TempBuffer,
                                              Width - Length, Flags);
                if (-1 == paddingReturnValue)
                {
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = written;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = written;
                }
            }
            /* types that sprintf can handle */
            else
            {
                TempInt = 0;

                /* %h (short) doesn't seem to be handled properly by local sprintf,
                   so lets do the truncation ourselves.  (ptr -> int -> short to avoid
                   warnings */
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;

                    TempInt = fprintf((FILE*)stream, TempBuff, trunc2);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short)n;

                    TempInt = fprintf((FILE*)stream, TempBuff, s);
                }
                else
                {
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = PAL_vfprintf(stream, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (-1 != TempInt)
                {
                    written += TempInt;
                }
            }
        }
        else
        {
#if FILE_OPS_CHECK_FERROR_OF_PREVIOUS_CALL
            clearerr((FILE*)stream);
#endif

            PAL_fwrite(Fmt++, 1, 1, stream); /* copy regular chars into buffer */
            if (stream->PALferrorCode == PAL_FILE_ERROR)
            {
                va_end(ap);
                return -1;
            }
            ++written;
        }
    }

    va_end(ap);
    return written;
}